

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_math.c
# Opt level: O0

_Bool math_tan(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_class_t *pgVar1;
  double __x;
  gravity_value_t value_00;
  gravity_value_t value_01;
  gravity_value_t value_02;
  gravity_value_t value_03;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar2;
  gravity_float_t computed_value_1;
  gravity_float_t computed_value;
  gravity_value_t value;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  pgVar1 = args[1].isa;
  __x = (double)args[1].field_1.n;
  if ((pgVar1 == gravity_class_null) && (__x == 0.0)) {
    value_03.field_1.n = 0;
    value_03.isa = gravity_class_int;
    gravity_vm_setslot(vm,value_03,rindex);
  }
  else if (pgVar1 == gravity_class_int) {
    aVar2.f = tan((double)(long)__x);
    value_02.field_1.n = aVar2.n;
    value_02.isa = gravity_class_float;
    gravity_vm_setslot(vm,value_02,rindex);
  }
  else if (pgVar1 == gravity_class_float) {
    aVar2.f = tan(__x);
    value_01.field_1.n = aVar2.n;
    value_01.isa = gravity_class_float;
    gravity_vm_setslot(vm,value_01,rindex);
  }
  else {
    value_00.field_1.n = 1;
    value_00.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_00,rindex);
  }
  return true;
}

Assistant:

static bool math_tan (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)
    gravity_value_t value = GET_VALUE(1);

    if (VALUE_ISA_NULL(value)) {
        RETURN_VALUE(VALUE_FROM_INT(0), rindex);
    }

    if (VALUE_ISA_INT(value)) {
        gravity_float_t computed_value = (gravity_float_t)TAN((gravity_float_t)value.n);
        RETURN_VALUE(VALUE_FROM_FLOAT(computed_value), rindex);
    }

    if (VALUE_ISA_FLOAT(value)) {
        gravity_float_t computed_value = (gravity_float_t)TAN((gravity_float_t)value.f);
        RETURN_VALUE(VALUE_FROM_FLOAT(computed_value), rindex);
    }

    // should be NaN
    RETURN_VALUE(VALUE_FROM_UNDEFINED, rindex);
}